

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O2

void __thiscall irr::video::CImage::fill(CImage *this,SColor *color)

{
  u8 *puVar1;
  ushort uVar2;
  u32 uVar3;
  u32 uVar4;
  u32 i;
  uint uVar5;
  u8 rgb [3];
  
  switch((this->super_IImage).Format) {
  case ECF_A1R5G5B5:
    uVar2 = SColor::toA1R5G5B5(color);
    break;
  case ECF_R5G6B5:
    uVar2 = A8R8G8B8toR5G6B5(color->color);
    break;
  case ECF_R8G8B8:
    CColorConverter::convert_A8R8G8B8toR8G8B8(color,1,rgb);
    uVar3 = IImage::getImageDataSizeInBytes(&this->super_IImage);
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 3) {
      puVar1 = (this->super_IImage).Data;
      puVar1[(ulong)uVar5 + 2] = rgb[2];
      *(undefined2 *)(puVar1 + uVar5) = rgb._0_2_;
    }
    return;
  case ECF_A8R8G8B8:
    uVar3 = color->color;
    goto LAB_002161df;
  default:
    return;
  }
  uVar3 = (uint)uVar2 * 0x10001;
LAB_002161df:
  puVar1 = (this->super_IImage).Data;
  uVar4 = IImage::getImageDataSizeInBytes(&this->super_IImage);
  memset32(puVar1,uVar3,(ulong)uVar4);
  return;
}

Assistant:

void CImage::fill(const SColor &color)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::fill method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	u32 c;

	switch (Format) {
	case ECF_A1R5G5B5:
		c = color.toA1R5G5B5();
		c |= c << 16;
		break;
	case ECF_R5G6B5:
		c = video::A8R8G8B8toR5G6B5(color.color);
		c |= c << 16;
		break;
	case ECF_A8R8G8B8:
		c = color.color;
		break;
	case ECF_R8G8B8: {
		u8 rgb[3];
		CColorConverter::convert_A8R8G8B8toR8G8B8(&color, 1, rgb);
		const u32 size = getImageDataSizeInBytes();
		for (u32 i = 0; i < size; i += 3) {
			memcpy(Data + i, rgb, 3);
		}
		return;
	} break;
	default:
		// TODO: Handle other formats
		return;
	}
	memset32(Data, c, getImageDataSizeInBytes());
}